

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_manifold(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_INT node1_00;
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  REF_INT new_cell;
  REF_INT local_c4;
  REF_BOOL has_side;
  REF_INT node3;
  REF_INT node2;
  REF_INT ncell;
  REF_INT cell_to_swap [2];
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  *allowed = 0;
  uVar1 = ref_swap_node23(ref_grid,node0,node1,&node2,&node3);
  if (uVar1 == 0) {
    uVar1 = ref_cell_list_with2(ref_cell,node0,node1,2,&ncell,cell_to_swap);
    if (uVar1 == 0) {
      if ((long)ncell != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x18b,"ref_swap_manifold","there should be two triangles for manifold",2,(long)ncell)
        ;
        return 1;
      }
      uVar1 = ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
      if (uVar1 == 0) {
        local_c4 = node3;
        nodes[1] = node3;
        nodes[2] = node2;
        nodes[0] = node0;
        uVar2 = ref_cell_with(ref_cell,nodes,&new_cell);
        uVar1 = 0;
        if ((uVar2 != 0) && (uVar2 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x192,"ref_swap_manifold",(ulong)uVar2,"with node0 failed");
          uVar1 = uVar2;
        }
        node1_00 = local_c4;
        if ((uVar2 != 5) && (uVar2 != 0)) {
          return uVar1;
        }
        if (new_cell == -1) {
          nodes[1] = node2;
          nodes[2] = local_c4;
          nodes[0] = node1;
          uVar2 = ref_cell_with(ref_cell,nodes,&new_cell);
          if ((uVar2 != 0) && (uVar2 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x19c,"ref_swap_manifold",(ulong)uVar2,"with node1 failed");
            uVar1 = uVar2;
          }
          if ((uVar2 != 5) && (uVar2 != 0)) {
            return uVar1;
          }
          if (new_cell == -1) {
            uVar1 = ref_cell_has_side(ref_cell,node2,node1_00,&has_side);
            if (uVar1 != 0) {
              uVar4 = (ulong)uVar1;
              pcVar5 = "find edge swap";
              uVar3 = 0x1a2;
              goto LAB_00201531;
            }
            if (has_side == 0) {
              *allowed = 1;
              return 0;
            }
          }
        }
        *allowed = 0;
        return 0;
      }
      uVar4 = (ulong)uVar1;
      pcVar5 = "nodes tri0";
      uVar3 = 0x18c;
    }
    else {
      uVar4 = (ulong)uVar1;
      pcVar5 = "more then two";
      uVar3 = 0x18a;
    }
  }
  else {
    uVar4 = (ulong)uVar1;
    pcVar5 = "other nodes";
    uVar3 = 0x188;
  }
LAB_00201531:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar3,
         "ref_swap_manifold",uVar4,pcVar5);
  return (REF_STATUS)uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_swap_manifold(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell;
  REF_INT cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_INT new_cell;
  REF_BOOL has_side;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");

  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
      "with node0 failed");
  if (REF_EMPTY != new_cell) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
      "with node1 failed");
  if (REF_EMPTY != new_cell) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  RSS(ref_cell_has_side(ref_cell, node2, node3, &has_side), "find edge swap");
  if (has_side) { /* would create an edge that already exists */
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}